

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,float,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  _Rb_tree_node_base *p_Var1;
  ostringstream *poVar2;
  ostream *poVar3;
  float fVar4;
  pointer pVVar5;
  pointer pVVar6;
  Variable<tcu::Vector<float,_4>_> *pVVar7;
  pointer pcVar8;
  Variable<float> *pVVar9;
  double dVar10;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar11;
  PrecisionCase *pPVar12;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar13;
  undefined8 uVar14;
  bool bVar15;
  ContextType type;
  int iVar16;
  _Rb_tree_node_base *p_Var17;
  char *pcVar18;
  size_t sVar19;
  long *plVar20;
  ShaderExecutor *pSVar21;
  long lVar22;
  IVal *pIVar23;
  IVal *pIVar24;
  TestError *this_00;
  uint uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  Vector<float,_4> *pVVar27;
  MessageBuilder *pMVar28;
  byte bVar29;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  ostringstream os;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  ostringstream oss;
  string local_528;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_500;
  pointer local_4f8;
  FloatFormat *local_4f0;
  undefined1 auStack_4e8 [7];
  IVal local_4e1;
  PrecisionCase *local_4e0;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [24];
  double local_4b0;
  double local_478;
  Statement *local_470;
  ulong local_468;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_460;
  undefined1 local_458 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  double local_438;
  Data local_430;
  undefined4 local_420;
  ios_base local_3e8 [8];
  ios_base local_3e0 [264];
  string local_2d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2b8;
  pointer local_288;
  ResultCollector *local_280;
  FloatFormat local_278;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_250;
  undefined1 local_220 [56];
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  bVar29 = 0;
  pVVar5 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar6 = (inputs->in0).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_478 = (double)((long)pVVar6 - (long)pVVar5 >> 4);
  local_500 = variables;
  local_470 = stmt;
  local_460 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Vector<float,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_250,(size_t)local_478);
  local_1e8._M_p = (pointer)&local_1d8;
  local_220._0_4_ = GLSL_VERSION_300_ES;
  local_220._8_8_ = (pointer)0x0;
  local_220._16_8_ = (pointer)0x0;
  local_220._24_8_ = (pointer)0x0;
  local_220._32_8_ = (pointer)0x0;
  local_220._40_8_ = (pointer)0x0;
  local_220._48_8_ = (pointer)0x0;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8._M_p = (pointer)&local_1b8;
  local_1c0 = 0;
  local_1b8._M_local_buf[0] = '\0';
  local_278.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_278.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_278.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_278.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_278.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_278.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_278.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_278.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_278._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2b8._M_impl.super__Rb_tree_header._M_header;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_458._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_458 + 8);
  local_2b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2b8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Statement: ",0xb);
  (*local_470->_vptr_Statement[2])(local_470,poVar2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4f8 = pVVar5;
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base(local_3e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var1 = (_Rb_tree_node_base *)(local_4d8 + 8);
  local_4d8._8_4_ = _S_red;
  local_4c8._0_8_ = (_Base_ptr)0x0;
  local_4b0 = 0.0;
  local_4c8._8_8_ = p_Var1;
  local_4c8._16_8_ = p_Var1;
  (*local_470->_vptr_Statement[4])(local_470,local_4d8);
  if ((_Rb_tree_node_base *)local_4c8._8_8_ != p_Var1) {
    p_Var17 = (_Rb_tree_node_base *)local_4c8._8_8_;
    do {
      (**(code **)(**(long **)(p_Var17 + 1) + 0x30))(*(long **)(p_Var17 + 1),local_1a8);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != p_Var1);
  }
  if (local_4b0 != 0.0) {
    local_458._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_458 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,local_528._M_dataplus._M_p,local_528._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2) {
      operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3e0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,"precision ",10);
  pcVar18 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar18 == (char *)0x0) {
    std::ios::clear((int)&local_528 + (int)*(undefined8 *)(local_458._0_8_ + -0x18) + 0xd0);
  }
  else {
    sVar19 = strlen(pcVar18);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458,pcVar18,sVar19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_458," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_220._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar20 = (long *)std::__cxx11::string::append(local_1a8);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar20 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar20 == paVar26) {
      local_448._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_448._8_8_ = plVar20[3];
      local_458._0_8_ = &local_448;
    }
    else {
      local_448._M_allocated_capacity = paVar26->_M_allocated_capacity;
      local_458._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar20;
    }
    local_458._8_8_ = plVar20[1];
    *plVar20 = (long)paVar26;
    plVar20[1] = 0;
    *(undefined1 *)(plVar20 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_1e8,(string *)local_458);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_458._0_8_ != &local_448) {
      operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 8),3);
  makeSymbol<float>((Symbol *)local_458,this,
                    (local_500->in2).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x70),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar14 + 0x70))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._0_8_ != &local_448) {
    operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_458,this,
             (local_500->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)(local_220._8_8_ + 0x38),(string *)local_458);
  glu::VarType::operator=(&((pointer)(uVar14 + 0x38))->varType,(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._0_8_ != &local_448) {
    operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
  }
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_458,this,
             (local_500->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar14 = local_220._8_8_;
  std::__cxx11::string::operator=((string *)local_220._8_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._0_8_ != &local_448) {
    operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_220 + 0x20),1);
  makeSymbol<tcu::Vector<float,4>>
            ((Symbol *)local_458,this,
             (local_500->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr);
  uVar14 = local_220._32_8_;
  std::__cxx11::string::operator=((string *)local_220._32_8_,(string *)local_458);
  glu::VarType::operator=((VarType *)(uVar14 + 0x20),(VarType *)&local_438);
  glu::VarType::~VarType((VarType *)&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._0_8_ != &local_448) {
    operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_458);
  (*local_470->_vptr_Statement[2])(local_470,local_458);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_458);
  std::ios_base::~ios_base(local_3e8);
  std::__cxx11::string::operator=((string *)&local_1c8,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar21 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_220)
  ;
  local_458._0_8_ =
       (local_460->in0).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_458._8_8_ =
       (local_460->in1).
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_448._M_allocated_capacity =
       (size_type)
       (local_460->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_448._8_8_ =
       (local_460->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_250.out0.
       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_250.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar21->_vptr_ShaderExecutor[3])
            (pSVar21,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar16 = (*pSVar21->_vptr_ShaderExecutor[2])(pSVar21);
  if ((char)iVar16 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar21->_vptr_ShaderExecutor[5])(pSVar21);
  (*pSVar21->_vptr_ShaderExecutor[6])(pSVar21,local_478,local_458,local_1a8);
  local_4f0 = &(this->m_ctx).floatFormat;
  local_4e0 = this;
  (*pSVar21->_vptr_ShaderExecutor[1])(pSVar21);
  pVVar11 = local_500;
  lVar22 = 0x10;
  do {
    *(undefined1 *)((long)&local_468 + lVar22) = 0;
    *(undefined8 *)((long)&local_460 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_458 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    *(undefined1 *)((long)&local_468 + lVar22) = 0;
    *(undefined8 *)((long)&local_460 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_458 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    local_1b8._M_local_buf[lVar22] = '\0';
    *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    local_1b8._M_local_buf[lVar22] = '\0';
    *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  local_528._M_dataplus._M_p = local_528._M_dataplus._M_p & 0xffffffffffffff00;
  local_528._M_string_length = 0x7ff0000000000000;
  local_528.field_2._M_allocated_capacity = 0xfff0000000000000;
  lVar22 = 0x10;
  do {
    auStack_4e8[lVar22] = 0;
    *(undefined8 *)((long)&local_4e0 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  lVar22 = 0x10;
  do {
    auStack_4e8[lVar22] = 0;
    *(undefined8 *)((long)&local_4e0 + lVar22) = 0x7ff0000000000000;
    *(undefined8 *)(local_4d8 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b8,
             (local_500->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_458);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b8,
             (pVVar11->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<float>
            ((Environment *)&local_2b8,
             (pVVar11->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)&local_528);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar11->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_2d8);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2b8,
             (pVVar11->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
             .m_ptr,(IVal *)local_4d8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2b8,
             (pVVar11->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4e1);
  if (pVVar6 == local_4f8) {
    local_468 = 0;
  }
  else {
    local_280 = &local_4e0->m_status;
    local_288 = (pointer)((long)local_478 + (ulong)(local_478 == 0.0));
    local_4f8 = (pointer)0x0;
    local_468 = 0;
    do {
      lVar22 = 0x10;
      do {
        local_1b8._M_local_buf[lVar22] = '\0';
        *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      lVar22 = 0x10;
      do {
        local_1b8._M_local_buf[lVar22] = '\0';
        *(undefined8 *)(local_1a8 + lVar22 + -8) = 0x7ff0000000000000;
        *(undefined8 *)(local_1a8 + lVar22) = 0xfff0000000000000;
        lVar22 = lVar22 + 0x18;
      } while (lVar22 != 0x70);
      if (((ulong)local_4f8 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4e0->super_TestCase).super_TestNode.m_testCtx);
      }
      pIVar13 = local_460;
      pVVar6 = local_4f8;
      pVVar5 = (local_460->in0).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)local_4f8;
      local_528._M_dataplus._M_p = *(pointer *)pVVar5->m_data;
      local_528._M_string_length = *(size_type *)(pVVar5->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_4d8,local_4f0,(Vector<float,_4> *)&local_528);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_458,local_4f0,(IVal *)local_4d8);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b8,
                           (local_500->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pMVar28 = (MessageBuilder *)local_458;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(TestLog **)pIVar23->m_data = pMVar28->m_log;
        pMVar28 = (MessageBuilder *)((long)pMVar28 + (ulong)bVar29 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      pVVar5 = (pIVar13->in1).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (long)pVVar6;
      local_528._M_dataplus._M_p = *(pointer *)pVVar5->m_data;
      local_528._M_string_length = *(size_type *)(pVVar5->m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_4d8,local_4f0,(Vector<float,_4> *)&local_528);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_458,local_4f0,(IVal *)local_4d8);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b8,
                           (local_500->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pVVar11 = local_500;
      pMVar28 = (MessageBuilder *)local_458;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(TestLog **)pIVar23->m_data = pMVar28->m_log;
        pMVar28 = (MessageBuilder *)((long)pMVar28 + (ulong)bVar29 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      fVar4 = (pIVar13->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[(long)local_4f8];
      dVar10 = (double)fVar4;
      bVar15 = NAN(fVar4);
      local_458[0] = bVar15;
      local_458._8_8_ = INFINITY;
      if (!bVar15) {
        local_458._8_8_ = dVar10;
      }
      local_448._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar15) {
        local_448._M_allocated_capacity = (size_type)dVar10;
      }
      tcu::FloatFormat::roundOut((Interval *)&local_528,local_4f0,(Interval *)local_458,false);
      tcu::FloatFormat::convert((Interval *)local_4d8,local_4f0,(Interval *)&local_528);
      pIVar24 = Environment::lookup<float>
                          ((Environment *)&local_2b8,
                           (pVVar11->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar24->m_hi = (double)local_4c8._0_8_;
      *(undefined8 *)pIVar24 = local_4d8._0_8_;
      pIVar24->m_lo = (double)CONCAT44(local_4d8._12_4_,local_4d8._8_4_);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2b8,
                 (pVVar11->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_430.basic.type = (local_4e0->m_ctx).precision;
      local_438 = local_4f0->m_maxValue;
      local_458._0_8_ = *(undefined8 *)local_4f0;
      local_458._8_8_ = *(undefined8 *)&local_4f0->m_fractionBits;
      local_448._M_allocated_capacity = *(undefined8 *)&local_4f0->m_hasInf;
      local_448._8_8_ = *(undefined8 *)&local_4f0->m_exactPrecision;
      local_420 = 0;
      local_430._8_8_ = &local_2b8;
      (*local_470->_vptr_Statement[3])(local_470,(MessageBuilder *)local_458);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2b8,
                           (pVVar11->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_458,&local_278,pIVar23);
      pMVar28 = (MessageBuilder *)local_458;
      pIVar23 = (IVal *)local_1a8;
      for (lVar22 = 0xc; lVar22 != 0; lVar22 = lVar22 + -1) {
        *(TestLog **)pIVar23->m_data = pMVar28->m_log;
        pMVar28 = (MessageBuilder *)((long)pMVar28 + (ulong)bVar29 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar29 * -2 + 1) * 8);
      }
      bVar15 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         ((IVal *)local_1a8,
                          local_250.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)pVVar6);
      local_458._0_8_ = &local_448;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_458,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(local_280,bVar15,(string *)local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._0_8_ != &local_448) {
        operator_delete((void *)local_458._0_8_,local_448._M_allocated_capacity + 1);
      }
      uVar25 = (int)local_468 + ((byte)~bVar15 & 1);
      local_468 = (ulong)uVar25;
      if ((int)uVar25 < 0x65 && !bVar15) {
        local_458._0_8_ = ((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_458 + 8));
        pcVar18 = "Failed";
        if (bVar15) {
          pcVar18 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),pcVar18,6);
        pIVar13 = local_460;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8)," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),"\t",1);
        pVVar7 = (local_500->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pVVar27 = (Vector<float,_4> *)local_4c8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_4d8._0_8_ = pVVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8),(char *)local_4d8._0_8_,
                   CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_528,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   ((pIVar13->in0).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar6),pVVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8),local_528._M_dataplus._M_p,local_528._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_4d8._0_8_ != (Vector<float,_4> *)local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),"\t",1);
        pVVar7 = (local_500->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pVVar27 = (Vector<float,_4> *)local_4c8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_4d8._0_8_ = pVVar27;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8),(char *)local_4d8._0_8_,
                   CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_528,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   ((pIVar13->in1).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar6),pVVar27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8),local_528._M_dataplus._M_p,local_528._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((Vector<float,_4> *)local_4d8._0_8_ != (Vector<float,_4> *)local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8),"\t",1);
        pVVar9 = (local_500->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_4d8._0_8_ = local_4c8;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_458 + 8),(char *)local_4d8._0_8_,
                   CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_458 + 8)," = ",3);
        valueToString<float>
                  (&local_528,&local_278,
                   (pIVar13->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)local_4f8);
        poVar3 = (ostream *)(local_458 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_528._M_dataplus._M_p,local_528._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_4d8._0_8_ != local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
        pVVar7 = (local_500->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                 .m_ptr;
        pIVar23 = (IVal *)local_4c8;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_4d8._0_8_ = pIVar23;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_4d8,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        poVar3 = (ostream *)(local_458 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)local_4d8._0_8_,CONCAT44(local_4d8._12_4_,local_4d8._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_528,(BuiltinPrecisionTests *)&local_278,
                   (FloatFormat *)
                   (local_250.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)pVVar6),
                   (Vector<float,_4> *)pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_528._M_dataplus._M_p,local_528._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_2d8,(BuiltinPrecisionTests *)&local_278,(FloatFormat *)local_1a8,pIVar23);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_4d8._0_8_ != (IVal *)local_4c8) {
          operator_delete((void *)local_4d8._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_4c8._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_458 + 8));
        std::ios_base::~ios_base(local_3e0);
      }
      local_4f8 = (pointer)((long)local_4f8->m_data + 1);
    } while (local_4f8 != local_288);
  }
  pPVar12 = local_4e0;
  iVar16 = (int)local_468;
  if (100 < iVar16) {
    local_458._0_8_ = ((local_4e0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_458 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"(Skipped ",9);
    std::ostream::operator<<(poVar2,iVar16 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_3e0);
  }
  if (iVar16 == 0) {
    local_458._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_458 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_458._0_8_ = ((pPVar12->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_458 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::ostream::operator<<(poVar2,iVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_458,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_458 + 8));
  std::ios_base::~ios_base(local_3e0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != &local_1b8) {
    operator_delete(local_1c8._M_p,
                    CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,
                    CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_220 + 8));
  if (local_250.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}